

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_X86.cpp
# Opt level: O3

void NULLC::AllowMemoryPageRead(void *addr)

{
  mprotect((void *)(((ulong)addr & 0xfffffffffffff000) + 0x1000),0x1000,3);
  return;
}

Assistant:

void AllowMemoryPageRead(void *addr)
	{
		void *alignedAddr = (void*)((uintptr_t(addr) & ~4095) + 4096);

#ifndef __linux
		DWORD unusedProtect;
		VirtualProtect(alignedAddr, 4096, PAGE_READWRITE, &unusedProtect);
#else
		mprotect(alignedAddr, 4096, PROT_READ | PROT_WRITE);
#endif
	}